

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall JetHead::Socket::getLocalAddress(Socket *this,Address *addr)

{
  Address local_88;
  Address local_54;
  int local_30;
  socklen_t local_2c;
  int res;
  socklen_t sock_len;
  sockaddr_in sock_addr;
  Address *addr_local;
  Socket *this_local;
  
  local_2c = 0x10;
  sock_addr.sin_zero = (uchar  [8])addr;
  local_30 = getsockname(this->mFd,(sockaddr *)&res,&local_2c);
  if (local_30 == 0) {
    Address::Address(&local_54,(sockaddr_in *)&res,local_2c);
    Address::operator=((Address *)sock_addr.sin_zero,&local_54);
    Address::~Address(&local_54);
  }
  else {
    Address::Address(&local_88);
    Address::operator=((Address *)sock_addr.sin_zero,&local_88);
    Address::~Address(&local_88);
  }
  return local_30;
}

Assistant:

int Socket::getLocalAddress( Socket::Address &addr )
{
	struct sockaddr_in sock_addr;
	socklen_t sock_len = sizeof( sock_addr );
	
	int res = getsockname( mFd, (struct sockaddr*)&sock_addr, &sock_len );
	
	if ( res == 0 )
	{
		addr = Socket::Address( &sock_addr, sock_len );
	}
	else
	{
		addr = Socket::Address();
	}
	
	return res;
}